

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_Layer * Internal_ON_Layer_Default(void)

{
  ON_UUID id_00;
  ON_Layer *in_RDI;
  ON_UUID id;
  ON_Layer *layer;
  
  ON_Layer::ON_Layer(in_RDI);
  ON_ModelComponent::SetParentId(&in_RDI->super_ON_ModelComponent,&ON_nil_uuid);
  id_00.Data4[0] = 0x8f;
  id_00.Data4[1] = '-';
  id_00.Data4[2] = 'K';
  id_00.Data4[3] = '\x12';
  id_00.Data4[4] = ':';
  id_00.Data4[5] = '\x16';
  id_00.Data4[6] = '`';
  id_00.Data4[7] = 0x89;
  id_00.Data1 = 0x61df99e;
  id_00.Data2 = 0x2ef8;
  id_00.Data3 = 0x4a3f;
  Internal_SystemModelComponentInit(id_00,-1,L"Default",&in_RDI->super_ON_ModelComponent);
  return in_RDI;
}

Assistant:

static ON_Layer Internal_ON_Layer_Default()
{
  // {061DF99E-2EF8-4A3F-8F2D-4B123A166089}
  const ON_UUID id = { 0x61df99e, 0x2ef8, 0x4a3f,{ 0x8f, 0x2d, 0x4b, 0x12, 0x3a, 0x16, 0x60, 0x89 } };
  ON_Layer layer;
  layer.SetParentId(ON_nil_uuid);
  Internal_SystemModelComponentInit(id, -1, L"Default", layer);
  return layer;
}